

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O3

Token * __thiscall
inja::Lexer::scan_body
          (Token *__return_storage_ptr__,Lexer *this,string_view close,Kind closeKind,
          string_view close_trim,bool trim)

{
  byte bVar1;
  MinusState MVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  char *local_38;
  
  uVar10 = close._M_len;
  uVar5 = (this->m_in)._M_len;
  uVar6 = this->tok_start;
  if (uVar5 <= uVar6) {
LAB_0016353c:
    pcVar7 = (this->m_in)._M_str;
    __return_storage_ptr__->kind = Eof;
    (__return_storage_ptr__->text)._M_len = 0;
    (__return_storage_ptr__->text)._M_str = pcVar7 + uVar5;
    return __return_storage_ptr__;
  }
  local_38 = close_trim._M_str;
LAB_00163485:
  pcVar7 = (this->m_in)._M_str;
  bVar1 = pcVar7[uVar6];
  if (((ulong)bVar1 < 0x21) && ((0x100002200U >> ((ulong)bVar1 & 0x3f) & 1) != 0))
  goto LAB_0016352c;
  if (close_trim._M_len != 0) {
    local_48._M_str = pcVar7 + uVar6;
    local_48._M_len = uVar5 - uVar6;
    if (close_trim._M_len <= local_48._M_len) {
      __str._M_str = local_38;
      __str._M_len = close_trim._M_len;
      iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_48,0,close_trim._M_len,__str);
      uVar5 = (this->m_in)._M_len;
      uVar6 = this->tok_start;
      if (iVar3 == 0) {
        this->state = Text;
        uVar10 = uVar6 + close_trim._M_len;
        uVar4 = uVar6;
        if (uVar5 < uVar6) {
          uVar4 = uVar5;
        }
        uVar8 = uVar10;
        if (uVar10 < uVar4) {
          uVar8 = uVar4;
        }
        this->pos = uVar10;
        if (uVar5 <= uVar8) {
          uVar8 = uVar5;
        }
        pcVar7 = (this->m_in)._M_str;
        uVar9 = uVar5 - uVar4;
        if (uVar8 - uVar4 <= uVar5 - uVar4) {
          uVar9 = uVar8 - uVar4;
        }
        __return_storage_ptr__->kind = closeKind;
        (__return_storage_ptr__->text)._M_len = uVar9;
        (__return_storage_ptr__->text)._M_str = pcVar7 + uVar4;
        if (uVar10 < uVar5) {
          uVar6 = uVar6 + close_trim._M_len;
          while( true ) {
            uVar10 = uVar6 + 1;
            uVar6 = (ulong)(byte)pcVar7[uVar6];
            if (0x20 < uVar6) {
              return __return_storage_ptr__;
            }
            if ((0x100002600U >> (uVar6 & 0x3f) & 1) == 0) break;
            this->pos = uVar10;
            uVar6 = uVar10;
            if (uVar10 == uVar5) {
              return __return_storage_ptr__;
            }
          }
          return __return_storage_ptr__;
        }
        return __return_storage_ptr__;
      }
    }
  }
  uVar4 = uVar5 - uVar6;
  if (uVar5 < uVar6) {
    ::std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr");
  }
  local_48._M_str = (this->m_in)._M_str + uVar6;
  local_48._M_len = uVar4;
  if ((uVar10 <= uVar4) &&
     (iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_48,0,uVar10,close), iVar3 == 0)) {
    this->state = Text;
    uVar5 = (this->m_in)._M_len;
    uVar6 = this->tok_start;
    uVar10 = uVar10 + uVar6;
    this->pos = uVar10;
    if (uVar5 < uVar6) {
      uVar6 = uVar5;
    }
    if (uVar10 < uVar6) {
      uVar10 = uVar6;
    }
    if (uVar5 <= uVar10) {
      uVar10 = uVar5;
    }
    uVar4 = uVar5 - uVar6;
    if (uVar10 - uVar6 <= uVar5 - uVar6) {
      uVar4 = uVar10 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str;
    __return_storage_ptr__->kind = closeKind;
    (__return_storage_ptr__->text)._M_len = uVar4;
    (__return_storage_ptr__->text)._M_str = pcVar7 + uVar6;
    if (!trim) {
      return __return_storage_ptr__;
    }
    skip_whitespaces_and_first_newline(this);
    return __return_storage_ptr__;
  }
  if (bVar1 == 10) {
    uVar5 = (this->m_in)._M_len;
    uVar6 = this->tok_start;
    goto LAB_0016352c;
  }
  uVar6 = this->tok_start;
  uVar5 = uVar6 + 1;
  this->pos = uVar5;
  iVar3 = isalpha((int)(char)bVar1);
  if (iVar3 != 0) {
    this->minus_state = Operator;
LAB_00163592:
    scan_id(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  MVar2 = this->minus_state;
  if (MVar2 == Operator) {
    this->minus_state = Number;
  }
  switch(bVar1) {
  case 0x21:
    uVar10 = (this->m_in)._M_len;
    pcVar7 = (this->m_in)._M_str;
    if ((uVar5 < uVar10) && (pcVar7[uVar5] == '=')) {
      uVar5 = uVar6 + 2;
      this->pos = uVar5;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = pcVar7 + uVar6;
      __return_storage_ptr__->kind = NotEqual;
      goto LAB_00163c7f;
    }
    goto LAB_00163a32;
  case 0x22:
    scan_string(this);
    return __return_storage_ptr__;
  case 0x23:
  case 0x26:
  case 0x27:
  case 0x3b:
  case 0x3f:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5c:
    goto switchD_00163639_caseD_23;
  case 0x24:
  case 0x40:
  case 0x5f:
    this->minus_state = Operator;
    goto LAB_00163592;
  case 0x25:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Percent;
    break;
  case 0x28:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = LeftParen;
    break;
  case 0x29:
    this->minus_state = Operator;
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = RightParen;
    break;
  case 0x2a:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Times;
    break;
  case 0x2b:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Plus;
    break;
  case 0x2c:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Comma;
    break;
  case 0x2d:
    if (MVar2 != Operator) goto LAB_00163643;
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Minus;
    break;
  case 0x2e:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Dot;
    break;
  case 0x2f:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Slash;
    break;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    this->minus_state = Operator;
LAB_00163643:
    scan_number(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x3a:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Colon;
    break;
  case 0x3c:
    uVar10 = (this->m_in)._M_len;
    pcVar7 = (this->m_in)._M_str;
    if ((uVar5 < uVar10) && (pcVar7[uVar5] == '=')) {
      uVar5 = uVar6 + 2;
      this->pos = uVar5;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = pcVar7 + uVar6;
      __return_storage_ptr__->kind = LessEqual;
    }
    else {
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = pcVar7 + uVar6;
      __return_storage_ptr__->kind = LessThan;
    }
    goto LAB_00163c7f;
  case 0x3d:
    uVar10 = (this->m_in)._M_len;
    pcVar7 = (this->m_in)._M_str;
    if ((uVar5 < uVar10) && (pcVar7[uVar5] == '=')) {
      uVar5 = uVar6 + 2;
      this->pos = uVar5;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = pcVar7 + uVar6;
      __return_storage_ptr__->kind = Equal;
      goto LAB_00163c7f;
    }
LAB_00163a32:
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = pcVar7 + uVar6;
    __return_storage_ptr__->kind = Unknown;
LAB_00163c7f:
    (__return_storage_ptr__->text)._M_len = uVar4;
    (__return_storage_ptr__->text)._M_str = pcVar7;
    return __return_storage_ptr__;
  case 0x3e:
    uVar10 = (this->m_in)._M_len;
    pcVar7 = (this->m_in)._M_str;
    if ((uVar5 < uVar10) && (pcVar7[uVar5] == '=')) {
      uVar5 = uVar6 + 2;
      this->pos = uVar5;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = pcVar7 + uVar6;
      __return_storage_ptr__->kind = GreaterEqual;
    }
    else {
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = pcVar7 + uVar6;
      __return_storage_ptr__->kind = GreaterThan;
    }
    goto LAB_00163c7f;
  case 0x5b:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = LeftBracket;
    break;
  case 0x5d:
    this->minus_state = Operator;
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = RightBracket;
    break;
  case 0x5e:
    uVar10 = (this->m_in)._M_len;
    if (uVar10 < uVar6) {
      uVar6 = uVar10;
    }
    if (uVar5 < uVar6) {
      uVar5 = uVar6;
    }
    if (uVar10 <= uVar5) {
      uVar5 = uVar10;
    }
    uVar4 = uVar10 - uVar6;
    if (uVar5 - uVar6 <= uVar10 - uVar6) {
      uVar4 = uVar5 - uVar6;
    }
    pcVar7 = (this->m_in)._M_str + uVar6;
    __return_storage_ptr__->kind = Power;
    break;
  default:
    if (bVar1 == 0x7b) {
      uVar10 = (this->m_in)._M_len;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = (this->m_in)._M_str + uVar6;
      __return_storage_ptr__->kind = LeftBrace;
      break;
    }
    if (bVar1 == 0x7d) {
      this->minus_state = Operator;
      uVar10 = (this->m_in)._M_len;
      if (uVar10 < uVar6) {
        uVar6 = uVar10;
      }
      if (uVar5 < uVar6) {
        uVar5 = uVar6;
      }
      if (uVar10 <= uVar5) {
        uVar5 = uVar10;
      }
      uVar4 = uVar10 - uVar6;
      if (uVar5 - uVar6 <= uVar10 - uVar6) {
        uVar4 = uVar5 - uVar6;
      }
      pcVar7 = (this->m_in)._M_str + uVar6;
      __return_storage_ptr__->kind = RightBrace;
      break;
    }
    goto switchD_00163639_caseD_23;
  }
LAB_00163c18:
  (__return_storage_ptr__->text)._M_len = uVar4;
  (__return_storage_ptr__->text)._M_str = pcVar7;
  return __return_storage_ptr__;
LAB_0016352c:
  uVar6 = uVar6 + 1;
  this->tok_start = uVar6;
  if (uVar5 <= uVar6) goto LAB_0016353c;
  goto LAB_00163485;
switchD_00163639_caseD_23:
  uVar10 = (this->m_in)._M_len;
  if (uVar10 < uVar6) {
    uVar6 = uVar10;
  }
  if (uVar5 < uVar6) {
    uVar5 = uVar6;
  }
  if (uVar10 <= uVar5) {
    uVar5 = uVar10;
  }
  uVar4 = uVar10 - uVar6;
  if (uVar5 - uVar6 <= uVar10 - uVar6) {
    uVar4 = uVar5 - uVar6;
  }
  pcVar7 = (this->m_in)._M_str + uVar6;
  __return_storage_ptr__->kind = Unknown;
  goto LAB_00163c18;
}

Assistant:

Token scan_body(std::string_view close, Token::Kind closeKind, std::string_view close_trim = std::string_view(), bool trim = false) {
  again:
    // skip whitespace (except for \n as it might be a close)
    if (tok_start >= m_in.size()) {
      return make_token(Token::Kind::Eof);
    }
    const char ch = m_in[tok_start];
    if (ch == ' ' || ch == '\t' || ch == '\r') {
      tok_start += 1;
      goto again;
    }

    // check for close
    if (!close_trim.empty() && inja::string_view::starts_with(m_in.substr(tok_start), close_trim)) {
      state = State::Text;
      pos = tok_start + close_trim.size();
      const Token tok = make_token(closeKind);
      skip_whitespaces_and_newlines();
      return tok;
    }

    if (inja::string_view::starts_with(m_in.substr(tok_start), close)) {
      state = State::Text;
      pos = tok_start + close.size();
      const Token tok = make_token(closeKind);
      if (trim) {
        skip_whitespaces_and_first_newline();
      }
      return tok;
    }

    // skip \n
    if (ch == '\n') {
      tok_start += 1;
      goto again;
    }

    pos = tok_start + 1;
    if (std::isalpha(ch)) {
      minus_state = MinusState::Operator;
      return scan_id();
    }

    const MinusState current_minus_state = minus_state;
    if (minus_state == MinusState::Operator) {
      minus_state = MinusState::Number;
    }

    switch (ch) {
    case '+':
      return make_token(Token::Kind::Plus);
    case '-':
      if (current_minus_state == MinusState::Operator) {
        return make_token(Token::Kind::Minus);
      }
      return scan_number();
    case '*':
      return make_token(Token::Kind::Times);
    case '/':
      return make_token(Token::Kind::Slash);
    case '^':
      return make_token(Token::Kind::Power);
    case '%':
      return make_token(Token::Kind::Percent);
    case '.':
      return make_token(Token::Kind::Dot);
    case ',':
      return make_token(Token::Kind::Comma);
    case ':':
      return make_token(Token::Kind::Colon);
    case '(':
      return make_token(Token::Kind::LeftParen);
    case ')':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightParen);
    case '[':
      return make_token(Token::Kind::LeftBracket);
    case ']':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightBracket);
    case '{':
      return make_token(Token::Kind::LeftBrace);
    case '}':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightBrace);
    case '>':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::GreaterEqual);
      }
      return make_token(Token::Kind::GreaterThan);
    case '<':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::LessEqual);
      }
      return make_token(Token::Kind::LessThan);
    case '=':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::Equal);
      }
      return make_token(Token::Kind::Unknown);
    case '!':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::NotEqual);
      }
      return make_token(Token::Kind::Unknown);
    case '\"':
      return scan_string();
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      minus_state = MinusState::Operator;
      return scan_number();
    case '_':
    case '@':
    case '$':
      minus_state = MinusState::Operator;
      return scan_id();
    default:
      return make_token(Token::Kind::Unknown);
    }
  }